

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O0

void __thiscall Electron::VideoOutput::setup_screen_map(VideoOutput *this)

{
  int local_40;
  int local_3c;
  int l_2;
  int l_1;
  int l;
  int local_2c [7];
  VideoOutput *pVStack_10;
  int c;
  VideoOutput *this_local;
  
  pVStack_10 = this;
  for (local_2c[6] = 0; local_2c[6] < 2; local_2c[6] = local_2c[6] + 1) {
    if ((local_2c[6] & 1U) == 0) {
      local_2c[1] = 2;
      local_2c[0] = 0x40;
      std::
      vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
      emplace_back<Electron::VideoOutput::DrawAction::Type,int>
                ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
                  *)&this->screen_map_,(Type *)(local_2c + 1),local_2c);
      l = 0;
      l_1 = 0x140;
      std::
      vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
      emplace_back<Electron::VideoOutput::DrawAction::Type,int>
                ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
                  *)&this->screen_map_,(Type *)&l,&l_1);
    }
    else {
      local_2c[5] = 0;
      local_2c[4] = 0x140;
      std::
      vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
      emplace_back<Electron::VideoOutput::DrawAction::Type,int>
                ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
                  *)&this->screen_map_,(Type *)(local_2c + 5),local_2c + 4);
      local_2c[3] = 2;
      local_2c[2] = 0x40;
      std::
      vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
      emplace_back<Electron::VideoOutput::DrawAction::Type,int>
                ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
                  *)&this->screen_map_,(Type *)(local_2c + 3),local_2c + 2);
    }
    for (l_2 = 0; l_2 < 0x1c; l_2 = l_2 + 1) {
      emplace_blank_line(this);
    }
    for (local_3c = 0; local_3c < 0x100; local_3c = local_3c + 1) {
      emplace_pixel_line(this);
    }
    for (local_40 = 0x11f; local_40 < 0x138; local_40 = local_40 + 1) {
      emplace_blank_line(this);
    }
    if ((local_2c[6] & 1U) != 0) {
      emplace_blank_line(this);
    }
  }
  return;
}

Assistant:

void VideoOutput::setup_screen_map() {
	/*

		Odd field:					Even field:

		|--S--|						   -S-|
		|--S--|						|--S--|
		|-S-B-|	= 3					|--S--| = 2.5
		|--B--|						|--B--|
		|--P--|						|--P--|
		|--B--| = 312				|--B--| = 312.5
		|-B-

	*/
	for(int c = 0; c < 2; c++) {
		if(c&1) {
			screen_map_.emplace_back(DrawAction::Sync, (cycles_per_line * 5) >> 1);
			screen_map_.emplace_back(DrawAction::Blank, cycles_per_line >> 1);
		} else {
			screen_map_.emplace_back(DrawAction::Blank, cycles_per_line >> 1);
			screen_map_.emplace_back(DrawAction::Sync, (cycles_per_line * 5) >> 1);
		}
		for(int l = 0; l < first_graphics_line - 3; l++) emplace_blank_line();
		for(int l = 0; l < 256; l++) emplace_pixel_line();
		for(int l = 256 + first_graphics_line; l < 312; l++) emplace_blank_line();
		if(c&1) emplace_blank_line();
	}
}